

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

Box * __thiscall Rml::Element::GetBox(Element *this,int index,Vector2f *offset)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  Vector2f VStack_30;
  int additional_box_index;
  Vector2f *local_28;
  Vector2f *offset_local;
  Element *pEStack_18;
  int index_local;
  Element *this_local;
  
  local_28 = offset;
  offset_local._4_4_ = index;
  pEStack_18 = this;
  Vector2<float>::Vector2(&stack0xffffffffffffffd0,0.0);
  *local_28 = VStack_30;
  iVar1 = offset_local._4_4_ + -1;
  if ((0 < offset_local._4_4_) &&
     (sVar2 = ::std::
              vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::
              size(&this->additional_boxes), iVar1 < (int)sVar2)) {
    pvVar3 = ::std::
             vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::
             operator[](&this->additional_boxes,(long)iVar1);
    *local_28 = pvVar3->offset;
    pvVar3 = ::std::
             vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::
             operator[](&this->additional_boxes,(long)iVar1);
    return &pvVar3->box;
  }
  return &this->main_box;
}

Assistant:

const Box& Element::GetBox(int index, Vector2f& offset)
{
	offset = Vector2f(0);

	const int additional_box_index = index - 1;
	if (index < 1 || additional_box_index >= (int)additional_boxes.size())
		return main_box;

	offset = additional_boxes[additional_box_index].offset;
	return additional_boxes[additional_box_index].box;
}